

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::
write_significand<fmt::v11::basic_appender<char>,char,unsigned_int,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,uint significand,int significand_size,int integral_size,
          char decimal_point,digit_grouping<char> *grouping)

{
  bool bVar1;
  make_unsigned_t<int> mVar2;
  char *pcVar3;
  basic_appender<char> out_00;
  int in_ECX;
  undefined8 in_RDI;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> buffer;
  digit_grouping<char> *in_stack_000005c0;
  basic_string_view<char> in_stack_000005c8;
  basic_appender<char> in_stack_000005d8;
  allocator<char> *in_stack_fffffffffffffd18;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffd20;
  buffer<char> *this;
  undefined8 in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  basic_appender<char> in_stack_fffffffffffffd38;
  basic_string_view<char> local_288;
  undefined8 local_278;
  buffer<char> *local_270;
  basic_appender<char> local_258 [2];
  buffer<char> local_248 [16];
  undefined8 local_30;
  int local_1c;
  undefined8 local_10;
  buffer<char> *local_8;
  
  local_1c = in_ECX;
  local_10 = in_RDI;
  bVar1 = digit_grouping<char>::has_separator((digit_grouping<char> *)0x70ab23);
  if (bVar1) {
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    basic_appender<char>::basic_appender(local_258,local_248);
    local_270 = (buffer<char> *)
                write_significand<fmt::v11::basic_appender<char>,_unsigned_int,_char,_0>
                          (in_stack_fffffffffffffd38,
                           (uint)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                           (int)in_stack_fffffffffffffd30,
                           (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                           (char)((ulong)in_stack_fffffffffffffd28 >> 0x18));
    local_278 = local_10;
    pcVar3 = buffer<char>::data(local_248);
    mVar2 = to_unsigned<int>(0);
    basic_string_view<char>::basic_string_view(&local_288,pcVar3,(ulong)mVar2);
    digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>
              (in_stack_000005c0,in_stack_000005d8,in_stack_000005c8);
    this = local_248;
    pcVar3 = buffer<char>::data(this);
    out_00.container = (buffer<char> *)(pcVar3 + local_1c);
    buffer<char>::end(this);
    local_8 = (buffer<char> *)
              copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                        ((char *)this,(char *)in_stack_fffffffffffffd18,out_00);
    basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x70acc6);
  }
  else {
    local_30 = local_10;
    local_8 = (buffer<char> *)
              write_significand<fmt::v11::basic_appender<char>,_unsigned_int,_char,_0>
                        (in_stack_fffffffffffffd38,(uint)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                         (int)in_stack_fffffffffffffd30,
                         (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                         (char)((ulong)in_stack_fffffffffffffd28 >> 0x18));
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(basic_appender<Char>(buffer), significand, significand_size,
                    integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_noinline<Char>(buffer.data() + integral_size,
                                     buffer.end(), out);
}